

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

ColumnRef __thiscall clickhouse::ColumnUUID::Slice(ColumnUUID *this,size_t begin,size_t len)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ColumnRef CVar2;
  undefined1 auStack_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<clickhouse::Column> local_28;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))
            (auStack_38,*(long **)(begin + 0x28),len * 2,in_RCX * 2);
  std::make_shared<clickhouse::ColumnUUID,std::shared_ptr<clickhouse::Column>>(&local_28);
  _Var1._M_pi = local_28.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_28.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column =
       (_func_int **)
       local_28.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_28.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnUUID::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnUUID>(data_->Slice(begin * 2, len * 2));
}